

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_avx2_256_64.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  undefined1 auVar1 [32];
  uint uVar2;
  longlong lVar3;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i alVar4;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  undefined1 auVar5 [32];
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i a_10;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [24];
  longlong *plVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int in_stack_00000008;
  __m256i vH_1;
  int32_t temp;
  int32_t column_len;
  int64_t *t;
  __m256i vCompare;
  int64_t tmp2;
  int64_t tmp_2;
  __m256i *pv;
  __m256i *vP;
  __m256i vH;
  __m256i vF;
  __m256i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m256i_64_t e;
  __m256i_64_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m256i vPosMask;
  __m256i vMaxH;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int64_t score;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  int64_t *boundary;
  __m256i *pvE;
  __m256i *pvHLoad;
  __m256i *pvHStore;
  __m256i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  ulong local_a60;
  ulong local_a58;
  int64_t local_a50;
  int local_a44;
  long local_a40;
  ulong local_a38;
  int local_a2c;
  long lVar45;
  undefined8 in_stack_fffffffffffff5e0;
  undefined8 in_stack_fffffffffffff5e8;
  longlong in_stack_fffffffffffff5f0;
  undefined8 in_stack_fffffffffffff5f8;
  undefined1 in_stack_fffffffffffff600 [16];
  undefined4 in_stack_fffffffffffff610;
  undefined4 in_stack_fffffffffffff614;
  longlong *local_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  long lStack_9c8;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  longlong local_960;
  longlong lStack_958;
  longlong lStack_950;
  longlong lStack_948;
  longlong local_920 [4];
  ulong local_900 [6];
  int local_8d0;
  int local_8cc;
  parasail_result_t *local_8c8;
  long local_8c0;
  long lStack_8b8;
  long lStack_8b0;
  long lStack_8a8;
  undefined1 local_8a0 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  ulong local_7f8;
  ulong local_7f0;
  ulong local_7e8;
  undefined1 local_7e0 [16];
  undefined1 auStack_7d0 [16];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  int64_t *local_788;
  __m256i *local_780;
  longlong *local_778;
  longlong *local_770;
  long local_768;
  int local_760;
  int local_75c;
  int local_758;
  int local_754;
  long local_750;
  int local_748;
  int local_744;
  int local_740;
  int local_73c;
  int local_738;
  int local_734;
  int local_730;
  int local_72c;
  int local_728;
  int local_724;
  long local_720;
  parasail_result_t *local_710;
  ulong local_708;
  ulong local_700;
  ulong local_6f8;
  ulong local_6f0;
  ulong local_6e8;
  long local_6e0;
  long lStack_6d8;
  long lStack_6d0;
  long lStack_6c8;
  long local_6c0;
  long lStack_6b8;
  long lStack_6b0;
  long lStack_6a8;
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  ulong local_680;
  ulong local_678;
  ulong local_670;
  ulong local_668;
  undefined1 local_660 [32];
  ulong local_640;
  ulong local_638;
  ulong local_630;
  ulong local_628;
  undefined1 local_620 [16];
  undefined1 auStack_610 [16];
  ulong local_600;
  ulong local_5f8;
  ulong local_5f0;
  ulong local_5e8;
  undefined1 local_5e0 [16];
  undefined1 auStack_5d0 [16];
  ulong local_5c0;
  ulong local_5b8;
  ulong local_5b0;
  ulong local_5a8;
  undefined1 local_5a0 [16];
  undefined1 auStack_590 [16];
  ulong local_580;
  ulong local_578;
  ulong local_570;
  ulong local_568;
  undefined1 local_560 [16];
  undefined1 auStack_550 [16];
  undefined8 local_540;
  undefined8 local_538;
  undefined8 local_530;
  undefined8 local_528;
  ulong local_520;
  ulong uStack_518;
  ulong uStack_510;
  ulong uStack_508;
  longlong *local_4e8;
  longlong local_4e0;
  longlong lStack_4d8;
  longlong lStack_4d0;
  longlong lStack_4c8;
  __m256i *local_4a8;
  ulong local_4a0;
  ulong uStack_498;
  ulong uStack_490;
  ulong uStack_488;
  longlong *local_468;
  __m256i *local_428;
  longlong *local_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  longlong *local_390;
  longlong *local_388;
  longlong *local_380;
  longlong *local_378;
  __m256i *local_370;
  undefined1 (*local_368) [32];
  undefined1 local_360 [16];
  undefined1 auStack_350 [16];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  ulong local_300;
  ulong uStack_2f8;
  ulong uStack_2f0;
  ulong uStack_2e8;
  undefined1 local_2e0 [16];
  undefined1 auStack_2d0 [16];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [16];
  undefined1 auStack_290 [16];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  longlong lStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  ulong local_240;
  ulong uStack_238;
  ulong uStack_230;
  ulong uStack_228;
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  long lStack_1e8;
  undefined1 local_1e0 [32];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  long lStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  long local_a0;
  long lStack_98;
  long lStack_90;
  long lStack_88;
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  local_734 = 0;
  local_738 = 0;
  local_73c = 0;
  local_740 = 0;
  local_744 = 0;
  local_748 = 0;
  local_750 = 0;
  local_754 = 0;
  local_758 = 0;
  local_75c = 0;
  local_760 = 0;
  local_768 = 0;
  local_770 = (longlong *)0x0;
  local_778 = (longlong *)0x0;
  local_780 = (__m256i *)0x0;
  local_788 = (int64_t *)0x0;
  local_7e8 = 0;
  local_7f0 = 0;
  local_7f8 = 0;
  local_8c8 = (parasail_result_t *)0x0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_avx2_256_64","profile");
    local_710 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x60) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_avx2_256_64",
            "profile->profile64.score");
    local_710 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_avx2_256_64",
            "profile->matrix");
    local_710 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_striped_profile_avx2_256_64",
            "profile->s1Len");
    local_710 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_avx2_256_64","s2");
    local_710 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_striped_profile_avx2_256_64","s2Len");
    local_710 = (parasail_result_t *)0x0;
  }
  else if (in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_striped_profile_avx2_256_64","open");
    local_710 = (parasail_result_t *)0x0;
  }
  else if (in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_striped_profile_avx2_256_64","gap");
    local_710 = (parasail_result_t *)0x0;
  }
  else {
    local_734 = 0;
    local_738 = 0;
    local_73c = 0;
    local_740 = *(int *)(in_RDI + 8);
    local_744 = local_740 + -1;
    local_748 = in_EDX + -1;
    local_750 = *(long *)(in_RDI + 0x10);
    local_754 = 4;
    local_758 = (local_740 + 3) / 4;
    local_75c = (local_740 + -1) % local_758;
    local_760 = ~((local_740 + -1) / local_758) + 4;
    local_768 = *(long *)(in_RDI + 0x60);
    local_6e8 = (ulong)in_ECX;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_6e8;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_6e8;
    local_6a0 = vpunpcklqdq_avx(auVar23,auVar31);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_6e8;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_6e8;
    auStack_690 = vpunpcklqdq_avx(auVar32,auVar40);
    local_7c0 = local_6a0._0_8_;
    uStack_7b8 = local_6a0._8_8_;
    uStack_7b0 = auStack_690._0_8_;
    uStack_7a8 = auStack_690._8_8_;
    local_6f0 = (ulong)in_R8D;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_6f0;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_6f0;
    auVar23 = vpunpcklqdq_avx(auVar24,auVar33);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_6f0;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = local_6f0;
    auVar24 = vpunpcklqdq_avx(auVar25,auVar41);
    local_660._0_16_ = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar24;
    local_660._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar23;
    if (-in_ECX < *(int *)(local_750 + 0x20)) {
      lVar20 = (long)in_ECX;
    }
    else {
      lVar20 = -(long)*(int *)(local_750 + 0x20);
    }
    lVar45 = lVar20 + -0x8000000000000000;
    local_7f8 = lVar20 + 0x8000000000000001;
    local_7f0 = 0x7ffffffffffffffe - (long)*(int *)(local_750 + 0x1c);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_7f8;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_7f8;
    local_620 = vpunpcklqdq_avx(auVar26,auVar34);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_7f8;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_7f8;
    auStack_610 = vpunpcklqdq_avx(auVar35,auVar42);
    local_820 = local_620._0_8_;
    uStack_818 = local_620._8_8_;
    uStack_810 = auStack_610._0_8_;
    uStack_808 = auStack_610._8_8_;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_7f0;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_7f0;
    local_5e0 = vpunpcklqdq_avx(auVar27,auVar36);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_7f0;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_7f0;
    auStack_5d0 = vpunpcklqdq_avx(auVar37,auVar43);
    local_840 = local_5e0._0_8_;
    uStack_838 = local_5e0._8_8_;
    uStack_830 = auStack_5d0._0_8_;
    uStack_828 = auStack_5d0._8_8_;
    local_860 = local_5e0._0_8_;
    uStack_858 = local_5e0._8_8_;
    uStack_850 = auStack_5d0._0_8_;
    uStack_848 = auStack_5d0._8_8_;
    local_880 = local_620._0_8_;
    uStack_878 = local_620._8_8_;
    uStack_870 = auStack_610._0_8_;
    uStack_868 = auStack_610._8_8_;
    local_8a0._16_8_ = auStack_610._0_8_;
    local_8a0._0_16_ = local_620;
    local_8a0._24_8_ = auStack_610._8_8_;
    local_708 = (ulong)local_760;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_708;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_708;
    local_5a0 = vpunpcklqdq_avx(auVar28,auVar38);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_708;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_708;
    auStack_590 = vpunpcklqdq_avx(auVar39,auVar44);
    local_528 = 0;
    local_530 = 1;
    local_538 = 2;
    local_540 = 3;
    local_560 = vpunpcklqdq_avx(ZEXT816(3),ZEXT816(2));
    auStack_550 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(0));
    local_6c0 = local_5a0._0_8_;
    lStack_6b8 = local_5a0._8_8_;
    lStack_6b0 = auStack_590._0_8_;
    lStack_6a8 = auStack_590._8_8_;
    local_6e0 = local_560._0_8_;
    lStack_6d8 = local_560._8_8_;
    lStack_6d0 = auStack_550._0_8_;
    lStack_6c8 = auStack_550._8_8_;
    local_8c0 = -(ulong)(local_5a0._0_8_ == local_560._0_8_);
    lStack_8b8 = -(ulong)(local_5a0._8_8_ == local_560._8_8_);
    lStack_8b0 = -(ulong)(auStack_590._0_8_ == auStack_550._0_8_);
    lStack_8a8 = -(ulong)(auStack_590._8_8_ == auStack_550._8_8_);
    local_7e8 = local_7f8;
    local_730 = in_R9D;
    local_72c = in_R8D;
    local_728 = in_ECX;
    local_724 = in_EDX;
    local_720 = in_RSI;
    local_700 = local_7f0;
    local_6f8 = local_7f8;
    local_680 = local_6e8;
    local_678 = local_6e8;
    local_670 = local_6e8;
    local_668 = local_6e8;
    local_640 = local_6f0;
    local_638 = local_6f0;
    local_630 = local_6f0;
    local_628 = local_6f0;
    local_600 = local_7f8;
    local_5f8 = local_7f8;
    local_5f0 = local_7f8;
    local_5e8 = local_7f8;
    local_5c0 = local_7f0;
    local_5b8 = local_7f0;
    local_5b0 = local_7f0;
    local_5a8 = local_7f0;
    local_580 = local_708;
    local_578 = local_708;
    local_570 = local_708;
    local_568 = local_708;
    local_7e0 = local_660._0_16_;
    auStack_7d0 = local_660._16_16_;
    local_8c8 = parasail_result_new();
    if (local_8c8 == (parasail_result_t *)0x0) {
      local_710 = (parasail_result_t *)0x0;
    }
    else {
      local_8c8->flag = local_8c8->flag | 0x4800802;
      uVar2 = 0;
      if (local_730 != 0) {
        uVar2 = 8;
      }
      local_8c8->flag = uVar2 | local_8c8->flag;
      uVar2 = 0;
      if (in_stack_00000008 != 0) {
        uVar2 = 0x10;
      }
      local_8c8->flag = uVar2 | local_8c8->flag;
      uVar2 = 0;
      if (s1_end != 0) {
        uVar2 = 0x4000;
      }
      local_8c8->flag = uVar2 | local_8c8->flag;
      uVar2 = 0;
      if (s2_beg != 0) {
        uVar2 = 0x8000;
      }
      local_8c8->flag = uVar2 | local_8c8->flag;
      local_770 = *parasail_memalign___m256i(0x20,(long)local_758);
      local_778 = *parasail_memalign___m256i(0x20,(long)local_758);
      local_780 = parasail_memalign___m256i(0x20,(long)local_758);
      local_788 = parasail_memalign_int64_t(0x20,(long)(local_724 + 1));
      if (local_770 == (longlong *)0x0) {
        local_710 = (parasail_result_t *)0x0;
      }
      else if (local_778 == (longlong *)0x0) {
        local_710 = (parasail_result_t *)0x0;
      }
      else if (local_780 == (__m256i *)0x0) {
        local_710 = (parasail_result_t *)0x0;
      }
      else if (local_788 == (int64_t *)0x0) {
        local_710 = (parasail_result_t *)0x0;
      }
      else {
        local_8cc = 0;
        local_734 = 0;
        while( true ) {
          if (local_758 <= local_734) break;
          for (local_8d0 = 0; local_8d0 < local_754; local_8d0 = local_8d0 + 1) {
            if (local_730 == 0) {
              local_a2c = -(local_72c * (local_8d0 * local_758 + local_734)) - local_728;
            }
            else {
              local_a2c = 0;
            }
            uVar21 = (ulong)local_a2c;
            local_a38 = uVar21;
            if ((long)uVar21 < -0x8000000000000000) {
              local_a38 = 0x8000000000000000;
            }
            local_900[local_8d0] = local_a38;
            local_a40 = uVar21 - (long)local_728;
            if (local_a40 < -0x8000000000000000) {
              local_a40 = -0x8000000000000000;
            }
            local_920[local_8d0] = local_a40;
          }
          local_3e8 = local_770 + (long)local_8cc * 4;
          *local_3e8 = local_900[0];
          local_3e8[1] = local_900[1];
          local_3e8[2] = local_900[2];
          local_3e8[3] = local_900[3];
          local_428 = local_780 + local_8cc;
          (*local_428)[0] = local_920[0];
          (*local_428)[1] = local_920[1];
          (*local_428)[2] = local_920[2];
          (*local_428)[3] = local_920[3];
          local_8cc = local_8cc + 1;
          local_734 = local_734 + 1;
        }
        *local_788 = 0;
        for (local_734 = 1; local_734 <= local_724; local_734 = local_734 + 1) {
          if (s1_end == 0) {
            local_a44 = -(local_72c * (local_734 + -1)) - local_728;
          }
          else {
            local_a44 = 0;
          }
          local_a50 = (int64_t)local_a44;
          if (local_a50 < -0x8000000000000000) {
            local_a50 = -0x8000000000000000;
          }
          local_788[local_734] = local_a50;
        }
        for (local_738 = 0; plVar18 = local_778, local_738 < local_724; local_738 = local_738 + 1) {
          local_980._8_8_ = uStack_818;
          local_980._0_8_ = local_820;
          local_980._16_8_ = uStack_810;
          local_980._24_8_ = uStack_808;
          auVar1 = vpermq_avx2(*(undefined1 (*) [32])(local_770 + (long)(local_758 + -1) * 4),0x90);
          auVar1 = vpblendd_avx2(auVar1,ZEXT1632(ZEXT816(0) << 0x40),3);
          lVar20 = local_768 +
                   (long)(*(int *)(*(long *)(local_750 + 0x10) +
                                  (ulong)*(byte *)(local_720 + local_738) * 4) * local_758) * 0x20;
          local_778 = local_770;
          local_770 = plVar18;
          local_9a0 = vpblendd_avx2(auVar1,ZEXT832((ulong)local_788[local_738]),3);
          for (local_734 = 0; local_734 < local_758; local_734 = local_734 + 1) {
            local_368 = (undefined1 (*) [32])(lVar20 + (long)local_734 * 0x20);
            local_3e0 = *(undefined8 *)*local_368;
            uStack_3d8 = *(undefined8 *)(*local_368 + 8);
            uStack_3d0 = *(undefined8 *)(*local_368 + 0x10);
            uStack_3c8 = *(undefined8 *)(*local_368 + 0x18);
            local_3c0 = local_9a0._0_8_;
            uStack_3b8 = local_9a0._8_8_;
            uStack_3b0 = local_9a0._16_8_;
            uStack_3a8 = local_9a0._24_8_;
            auVar1 = vpaddq_avx2(local_9a0,*local_368);
            local_370 = local_780 + local_734;
            auVar17 = *(undefined1 (*) [24])*local_370;
            lVar3 = (*local_370)[3];
            alVar4 = *local_370;
            local_9a0._0_8_ = auVar1._0_8_;
            local_9a0._8_8_ = auVar1._8_8_;
            local_9a0._16_8_ = auVar1._16_8_;
            local_9a0._24_8_ = auVar1._24_8_;
            a[1] = in_stack_fffffffffffff600._0_8_;
            a[2] = in_stack_fffffffffffff600._8_8_;
            a[0] = in_stack_fffffffffffff5f8;
            a[3]._0_4_ = in_stack_fffffffffffff610;
            a[3]._4_4_ = in_stack_fffffffffffff614;
            b[1] = in_stack_fffffffffffff5e0;
            b[0] = lVar45;
            b[2] = in_stack_fffffffffffff5e8;
            b[3] = in_stack_fffffffffffff5f0;
            _mm256_max_epi64_rpl(a,b);
            a_00[1] = in_stack_fffffffffffff600._0_8_;
            a_00[2] = in_stack_fffffffffffff600._8_8_;
            a_00[0] = in_stack_fffffffffffff5f8;
            a_00[3]._0_4_ = in_stack_fffffffffffff610;
            a_00[3]._4_4_ = in_stack_fffffffffffff614;
            b_00[1] = in_stack_fffffffffffff5e0;
            b_00[0] = lVar45;
            b_00[2] = in_stack_fffffffffffff5e8;
            b_00[3] = in_stack_fffffffffffff5f0;
            _mm256_max_epi64_rpl(a_00,b_00);
            local_468 = local_770 + (long)local_734 * 4;
            *local_468 = local_9a0._0_8_;
            local_468[1] = local_9a0._8_8_;
            local_468[2] = local_9a0._16_8_;
            local_468[3] = local_9a0._24_8_;
            a_01[1] = in_stack_fffffffffffff600._0_8_;
            a_01[2] = in_stack_fffffffffffff600._8_8_;
            a_01[0] = in_stack_fffffffffffff5f8;
            a_01[3]._0_4_ = in_stack_fffffffffffff610;
            a_01[3]._4_4_ = in_stack_fffffffffffff614;
            b_01[1] = in_stack_fffffffffffff5e0;
            b_01[0] = lVar45;
            b_01[2] = in_stack_fffffffffffff5e8;
            b_01[3] = in_stack_fffffffffffff5f0;
            local_4a0 = local_9a0._0_8_;
            uStack_498 = local_9a0._8_8_;
            uStack_490 = local_9a0._16_8_;
            uStack_488 = local_9a0._24_8_;
            _mm256_max_epi64_rpl(a_01,b_01);
            a_02[1] = in_stack_fffffffffffff600._0_8_;
            a_02[2] = in_stack_fffffffffffff600._8_8_;
            a_02[0] = in_stack_fffffffffffff5f8;
            a_02[3]._0_4_ = in_stack_fffffffffffff610;
            a_02[3]._4_4_ = in_stack_fffffffffffff614;
            b_02[1] = in_stack_fffffffffffff5e0;
            b_02[0] = lVar45;
            b_02[2] = in_stack_fffffffffffff5e8;
            b_02[3] = in_stack_fffffffffffff5f0;
            _mm256_min_epi64_rpl(a_02,b_02);
            a_03[1] = in_stack_fffffffffffff600._0_8_;
            a_03[2] = in_stack_fffffffffffff600._8_8_;
            a_03[0] = in_stack_fffffffffffff5f8;
            a_03[3]._0_4_ = in_stack_fffffffffffff610;
            a_03[3]._4_4_ = in_stack_fffffffffffff614;
            b_03[1] = in_stack_fffffffffffff5e0;
            b_03[0] = lVar45;
            b_03[2] = in_stack_fffffffffffff5e8;
            b_03[3] = in_stack_fffffffffffff5f0;
            _mm256_min_epi64_rpl(a_03,b_03);
            a_04[1] = in_stack_fffffffffffff600._0_8_;
            a_04[2] = in_stack_fffffffffffff600._8_8_;
            a_04[0] = in_stack_fffffffffffff5f8;
            a_04[3]._0_4_ = in_stack_fffffffffffff610;
            a_04[3]._4_4_ = in_stack_fffffffffffff614;
            b_04[1] = in_stack_fffffffffffff5e0;
            b_04[0] = lVar45;
            b_04[2] = in_stack_fffffffffffff5e8;
            b_04[3] = in_stack_fffffffffffff5f0;
            _mm256_min_epi64_rpl(a_04,b_04);
            local_260 = local_7c0;
            uStack_258 = uStack_7b8;
            uStack_250 = uStack_7b0;
            uStack_248 = uStack_7a8;
            auVar11._16_8_ = local_9a0._16_8_;
            auVar11._0_16_ = local_9a0._0_16_;
            auVar11._24_8_ = local_9a0._24_8_;
            auVar10._8_8_ = uStack_7b8;
            auVar10._0_8_ = local_7c0;
            auVar10._16_8_ = uStack_7b0;
            auVar10._24_8_ = uStack_7a8;
            vpsubq_avx2(auVar11,auVar10);
            local_960 = auVar17._0_8_;
            lStack_958 = auVar17._8_8_;
            lStack_950 = auVar17._16_8_;
            local_280 = local_960;
            uStack_278 = lStack_958;
            uStack_270 = lStack_950;
            auVar9._16_8_ = auStack_7d0._0_8_;
            auVar9._0_16_ = local_7e0;
            auVar9._24_8_ = auStack_7d0._8_8_;
            auVar1 = vpsubq_avx2((undefined1  [32])alVar4,auVar9);
            local_960 = auVar1._0_8_;
            lStack_958 = auVar1._8_8_;
            lStack_950 = auVar1._16_8_;
            lStack_948 = auVar1._24_8_;
            a_05[1] = in_stack_fffffffffffff600._0_8_;
            a_05[2] = in_stack_fffffffffffff600._8_8_;
            a_05[0] = in_stack_fffffffffffff5f8;
            a_05[3]._0_4_ = in_stack_fffffffffffff610;
            a_05[3]._4_4_ = in_stack_fffffffffffff614;
            alVar4[1] = in_stack_fffffffffffff5e0;
            alVar4[0] = lVar45;
            alVar4[2] = in_stack_fffffffffffff5e8;
            alVar4[3] = in_stack_fffffffffffff5f0;
            lStack_268 = lVar3;
            local_240 = local_9a0._0_8_;
            uStack_238 = local_9a0._8_8_;
            uStack_230 = local_9a0._16_8_;
            uStack_228 = local_9a0._24_8_;
            local_2a0 = local_7e0;
            auStack_290 = auStack_7d0;
            _mm256_max_epi64_rpl(a_05,alVar4);
            local_4a8 = local_780 + local_734;
            (*local_4a8)[0] = local_960;
            (*local_4a8)[1] = lStack_958;
            (*local_4a8)[2] = lStack_950;
            (*local_4a8)[3] = lStack_948;
            local_2c0 = local_980._0_8_;
            uStack_2b8 = local_980._8_8_;
            uStack_2b0 = local_980._16_8_;
            uStack_2a8 = local_980._24_8_;
            auVar1._16_8_ = auStack_7d0._0_8_;
            auVar1._0_16_ = local_7e0;
            auVar1._24_8_ = auStack_7d0._8_8_;
            auVar1 = vpsubq_avx2(local_980,auVar1);
            local_980._0_8_ = auVar1._0_8_;
            local_980._8_8_ = auVar1._8_8_;
            local_980._16_8_ = auVar1._16_8_;
            local_980._24_8_ = auVar1._24_8_;
            a_06[1] = in_stack_fffffffffffff600._0_8_;
            a_06[2] = in_stack_fffffffffffff600._8_8_;
            a_06[0] = in_stack_fffffffffffff5f8;
            a_06[3]._0_4_ = in_stack_fffffffffffff610;
            a_06[3]._4_4_ = in_stack_fffffffffffff614;
            b_05[1] = in_stack_fffffffffffff5e0;
            b_05[0] = lVar45;
            b_05[2] = in_stack_fffffffffffff5e8;
            b_05[3] = in_stack_fffffffffffff5f0;
            local_4e0 = local_960;
            lStack_4d8 = lStack_958;
            lStack_4d0 = lStack_950;
            lStack_4c8 = lStack_948;
            local_2e0 = local_7e0;
            auStack_2d0 = auStack_7d0;
            _mm256_max_epi64_rpl(a_06,b_05);
            local_378 = local_778 + (long)local_734 * 4;
            local_9a0 = *(undefined1 (*) [32])local_378;
          }
          for (local_73c = 0; local_73c < local_754; local_73c = local_73c + 1) {
            if (s1_end == 0) {
              local_a58 = local_788[local_738 + 1] - (long)local_728;
            }
            else {
              local_a58 = (ulong)-local_728;
            }
            if ((long)local_a58 < -0x8000000000000000) {
              local_a60 = 0x8000000000000000;
            }
            else {
              local_a60 = local_a58;
            }
            auVar1 = vpermq_avx2(local_980,0x90);
            auVar1 = vpblendd_avx2(auVar1,ZEXT1632(ZEXT816(0) << 0x40),3);
            local_980 = vpblendd_avx2(auVar1,ZEXT832(local_a60),3);
            for (local_734 = 0; local_734 < local_758; local_734 = local_734 + 1) {
              local_380 = local_770 + (long)local_734 * 4;
              auVar17 = *(undefined1 (*) [24])local_380;
              uVar21 = *(ulong *)*(undefined1 (*) [24])(local_380 + 3);
              local_9a0._0_8_ = auVar17._0_8_;
              local_9a0._8_8_ = auVar17._8_8_;
              local_9a0._16_8_ = auVar17._16_8_;
              a_07[1] = in_stack_fffffffffffff600._0_8_;
              a_07[2] = in_stack_fffffffffffff600._8_8_;
              a_07[0] = in_stack_fffffffffffff5f8;
              a_07[3]._0_4_ = in_stack_fffffffffffff610;
              a_07[3]._4_4_ = in_stack_fffffffffffff614;
              b_06[1] = in_stack_fffffffffffff5e0;
              b_06[0] = lVar45;
              b_06[2] = in_stack_fffffffffffff5e8;
              b_06[3] = in_stack_fffffffffffff5f0;
              uVar22 = local_9a0._0_8_;
              uVar29 = local_9a0._8_8_;
              uVar30 = local_9a0._16_8_;
              _mm256_max_epi64_rpl(a_07,b_06);
              local_9a0._8_8_ = uVar29;
              local_9a0._0_8_ = uVar22;
              local_4e8 = local_770 + (long)local_734 * 4;
              *local_4e8 = uVar22;
              local_4e8[1] = uVar29;
              local_4e8[2] = uVar30;
              local_4e8[3] = uVar21;
              a_08[1] = in_stack_fffffffffffff600._0_8_;
              a_08[2] = in_stack_fffffffffffff600._8_8_;
              a_08[0] = in_stack_fffffffffffff5f8;
              a_08[3]._0_4_ = in_stack_fffffffffffff610;
              a_08[3]._4_4_ = in_stack_fffffffffffff614;
              b_07[1] = in_stack_fffffffffffff5e0;
              b_07[0] = lVar45;
              b_07[2] = in_stack_fffffffffffff5e8;
              b_07[3] = in_stack_fffffffffffff5f0;
              local_520 = uVar22;
              uStack_518 = uVar29;
              uStack_510 = uVar30;
              uStack_508 = uVar21;
              _mm256_min_epi64_rpl(a_08,b_07);
              a_09[1] = in_stack_fffffffffffff600._0_8_;
              a_09[2] = in_stack_fffffffffffff600._8_8_;
              a_09[0] = in_stack_fffffffffffff5f8;
              a_09[3]._0_4_ = in_stack_fffffffffffff610;
              a_09[3]._4_4_ = in_stack_fffffffffffff614;
              b_08[1] = in_stack_fffffffffffff5e0;
              b_08[0] = lVar45;
              b_08[2] = in_stack_fffffffffffff5e8;
              b_08[3] = in_stack_fffffffffffff5f0;
              _mm256_max_epi64_rpl(a_09,b_08);
              local_320 = local_7c0;
              uStack_318 = uStack_7b8;
              uStack_310 = uStack_7b0;
              uStack_308 = uStack_7a8;
              auVar8._16_8_ = uVar30;
              auVar8._0_16_ = local_9a0._0_16_;
              auVar8._24_8_ = uVar21;
              auVar7._8_8_ = uStack_7b8;
              auVar7._0_8_ = local_7c0;
              auVar7._16_8_ = uStack_7b0;
              auVar7._24_8_ = uStack_7a8;
              auVar1 = vpsubq_avx2(auVar8,auVar7);
              local_340 = local_980._0_8_;
              uStack_338 = local_980._8_8_;
              uStack_330 = local_980._16_8_;
              uStack_328 = local_980._24_8_;
              auVar6._16_8_ = auStack_7d0._0_8_;
              auVar6._0_16_ = local_7e0;
              auVar6._24_8_ = auStack_7d0._8_8_;
              local_980 = vpsubq_avx2(local_980,auVar6);
              local_e0 = local_980._0_8_;
              uStack_d8 = local_980._8_8_;
              uStack_d0 = local_980._16_8_;
              uStack_c8 = local_980._24_8_;
              local_9a0._0_8_ = auVar1._0_8_;
              local_100 = local_9a0._0_8_;
              local_9a0._8_8_ = auVar1._8_8_;
              uStack_f8 = local_9a0._8_8_;
              local_9a0._16_8_ = auVar1._16_8_;
              uStack_f0 = local_9a0._16_8_;
              local_9a0._24_8_ = auVar1._24_8_;
              uStack_e8 = local_9a0._24_8_;
              local_1e0 = vpcmpgtq_avx2(local_980,auVar1);
              local_300 = uVar22;
              uStack_2f8 = uVar29;
              uStack_2f0 = uVar30;
              uStack_2e8 = uVar21;
              auStack_350 = auStack_7d0;
              local_360 = local_7e0;
              if ((((((((((((((((((((((((((((((((local_1e0 >> 7 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (local_1e0 >> 0xf & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (local_1e0 >> 0x17 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (local_1e0 >> 0x1f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (local_1e0 >> 0x27 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (local_1e0 >> 0x2f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (local_1e0 >> 0x37 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (local_1e0 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (local_1e0 >> 0x47 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (local_1e0 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (local_1e0 >> 0x57 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (local_1e0 >> 0x5f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (local_1e0 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (local_1e0 >> 0x6f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_1e0 >> 0x77 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_1e0 >> 0x7f,0) == '\0') &&
                                (local_1e0 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (local_1e0 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (local_1e0 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (local_1e0 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_1e0 >> 0xa7 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                           (local_1e0 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_1e0 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_1e0 >> 0xbf,0) == '\0') &&
                        (local_1e0 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (local_1e0 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_1e0 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (local_1e0 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_1e0 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_1e0 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_1e0 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < local_1e0[0x1f]) goto LAB_00bc0057;
            }
          }
LAB_00bc0057:
          local_388 = local_770 + (long)local_75c * 4;
          auVar17 = *(undefined1 (*) [24])local_388;
          lVar20 = *(long *)*(undefined1 (*) [24])(local_388 + 3);
          local_9a0._0_8_ = auVar17._0_8_;
          local_9a0._8_8_ = auVar17._8_8_;
          local_9a0._16_8_ = auVar17._16_8_;
          local_120 = local_9a0._0_8_;
          uStack_118 = local_9a0._8_8_;
          uStack_110 = local_9a0._16_8_;
          local_140 = local_8a0._0_8_;
          uStack_138 = local_8a0._8_8_;
          uStack_130 = local_8a0._16_8_;
          uStack_128 = local_8a0._24_8_;
          local_c0 = vpcmpgtq_avx2(*(undefined1 (*) [32])local_388,local_8a0);
          local_a0 = local_8c0;
          lStack_98 = lStack_8b8;
          lStack_90 = lStack_8b0;
          lStack_88 = lStack_8a8;
          auVar16._8_8_ = lStack_8b8;
          auVar16._0_8_ = local_8c0;
          auVar16._16_8_ = lStack_8b0;
          auVar16._24_8_ = lStack_8a8;
          auVar1 = vpand_avx2(auVar16,local_c0);
          a_10[1] = in_stack_fffffffffffff600._0_8_;
          a_10[2] = in_stack_fffffffffffff600._8_8_;
          a_10[0] = in_stack_fffffffffffff5f8;
          a_10[3]._0_4_ = in_stack_fffffffffffff610;
          a_10[3]._4_4_ = in_stack_fffffffffffff614;
          b_09[1] = in_stack_fffffffffffff5e0;
          b_09[0] = lVar45;
          b_09[2] = in_stack_fffffffffffff5e8;
          b_09[3] = in_stack_fffffffffffff5f0;
          lStack_108 = lVar20;
          _mm256_max_epi64_rpl(a_10,b_09);
          local_8a0._8_8_ = local_9a0._8_8_;
          local_8a0._0_8_ = local_9a0._0_8_;
          local_8a0._16_8_ = local_9a0._16_8_;
          local_8a0._24_8_ = lVar20;
          local_9e0 = auVar1._0_8_;
          local_200 = local_9e0;
          uStack_9d8 = auVar1._8_8_;
          uStack_1f8 = uStack_9d8;
          uStack_9d0 = auVar1._16_8_;
          uStack_1f0 = uStack_9d0;
          lStack_9c8 = auVar1._24_8_;
          lStack_1e8 = lStack_9c8;
          if ((((((((((((((((((((((((((((((((auVar1 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar1 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar1 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar1 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar1 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar1 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar1 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar1 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar1 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar1 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   ) || (auVar1 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                 (auVar1 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                || (auVar1 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (auVar1 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (auVar1 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             SUB321(auVar1 >> 0x7f,0) != '\0') ||
                            (auVar1 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar1 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar1 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar1 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar1 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar1 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar1 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar1 >> 0xbf,0) != '\0') ||
                    (auVar1 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar1 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar1 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar1 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar1 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar1 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar1 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || lStack_9c8 < 0)
          {
            local_748 = local_738;
          }
        }
        if (s2_beg != 0) {
          for (local_73c = 0; local_73c < local_760; local_73c = local_73c + 1) {
            auVar1 = vpermq_avx2(local_8a0,0x90);
            local_8a0 = vpblendd_avx2(auVar1,ZEXT1632(ZEXT816(0) << 0x40),3);
          }
          local_7f8 = local_8a0._24_8_;
          local_744 = local_740 + -1;
        }
        if (in_stack_00000008 != 0) {
          local_9e8 = local_770;
          for (local_734 = 0; local_734 < local_758 * local_754; local_734 = local_734 + 1) {
            iVar19 = local_734 / local_754 + (local_734 % local_754) * local_758;
            if (iVar19 < local_740) {
              if ((long)local_7f8 < *local_9e8) {
                local_7f8 = *local_9e8;
                local_748 = local_724 + -1;
                local_744 = iVar19;
              }
              else if (((*local_9e8 == local_7f8) && (local_748 == local_724 + -1)) &&
                      (iVar19 < local_744)) {
                local_744 = iVar19;
              }
            }
            local_9e8 = local_9e8 + 1;
          }
        }
        if ((in_stack_00000008 == 0) && (s2_beg == 0)) {
          local_390 = local_770 + (long)local_75c * 4;
          uVar21 = *local_390;
          uVar22 = local_390[1];
          uVar29 = local_390[2];
          local_7f8 = local_390[3];
          for (local_73c = 0; local_73c < local_760; local_73c = local_73c + 1) {
            auVar5._8_8_ = uVar22;
            auVar5._0_8_ = uVar21;
            auVar5._16_8_ = uVar29;
            auVar5._24_8_ = local_7f8;
            auVar1 = vpermq_avx2(auVar5,0x90);
            auVar1 = vpblendd_avx2(auVar1,ZEXT1632(ZEXT816(0) << 0x40),3);
            uVar21 = auVar1._0_8_;
            uVar22 = auVar1._8_8_;
            uVar29 = auVar1._16_8_;
            local_7f8 = auVar1._24_8_;
          }
          local_748 = local_724 + -1;
          local_744 = local_740 + -1;
        }
        local_160 = local_820;
        uStack_158 = uStack_818;
        uStack_150 = uStack_810;
        uStack_148 = uStack_808;
        local_180 = local_860;
        uStack_178 = uStack_858;
        uStack_170 = uStack_850;
        uStack_168 = uStack_848;
        auVar15._8_8_ = uStack_818;
        auVar15._0_8_ = local_820;
        auVar15._16_8_ = uStack_810;
        auVar15._24_8_ = uStack_808;
        auVar14._8_8_ = uStack_858;
        auVar14._0_8_ = local_860;
        auVar14._16_8_ = uStack_850;
        auVar14._24_8_ = uStack_848;
        local_60 = vpcmpgtq_avx2(auVar15,auVar14);
        local_1a0 = local_880;
        uStack_198 = uStack_878;
        uStack_190 = uStack_870;
        uStack_188 = uStack_868;
        local_1c0 = local_840;
        uStack_1b8 = uStack_838;
        uStack_1b0 = uStack_830;
        uStack_1a8 = uStack_828;
        auVar13._8_8_ = uStack_878;
        auVar13._0_8_ = local_880;
        auVar13._16_8_ = uStack_870;
        auVar13._24_8_ = uStack_868;
        auVar12._8_8_ = uStack_838;
        auVar12._0_8_ = local_840;
        auVar12._16_8_ = uStack_830;
        auVar12._24_8_ = uStack_828;
        local_80 = vpcmpgtq_avx2(auVar13,auVar12);
        local_220 = vpor_avx2(local_60,local_80);
        if ((((((((((((((((((((((((((((((((local_220 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_220 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_220 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_220 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_220 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_220 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_220 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_220 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_220 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_220 >> 0x4f & (undefined1  [32])0x1) !=
                                 (undefined1  [32])0x0) ||
                                (local_220 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (local_220 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (local_220 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || (local_220 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             ) || (local_220 >> 0x77 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(local_220 >> 0x7f,0) != '\0') ||
                          (local_220 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_220 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_220 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_220 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_220 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_220 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_220 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_220 >> 0xbf,0) != '\0') ||
                  (local_220 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_220 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_220 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_220 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_220 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_220 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_220 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_220[0x1f] < '\0') {
          local_8c8->flag = local_8c8->flag | 0x40;
          local_7f8 = 0;
          local_744 = 0;
          local_748 = 0;
        }
        local_8c8->score = (int)local_7f8;
        local_8c8->end_query = local_744;
        local_8c8->end_ref = local_748;
        parasail_free(local_788);
        parasail_free(local_780);
        parasail_free(local_778);
        parasail_free(local_770);
        local_710 = local_8c8;
      }
    }
  }
  return local_710;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi64_rpl(vH, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_sub_epi64(vH, vGapO);
            vE = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_sub_epi64(vH, vGapO);
                vF = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi64(vF, vH))) goto end;
                /*vF = _mm256_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m256i vCompare;
            vH = _mm256_load_si256(pvHStore + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi64(vH, vMaxH));
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}